

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Editor.cxx
# Opt level: O2

void __thiscall
Fl_Text_Editor::remove_key_binding(Fl_Text_Editor *this,int key,int state,Key_Binding **list)

{
  Key_Binding *pKVar1;
  Key_Binding *pKVar2;
  Key_Binding **ppKVar3;
  
  pKVar2 = (Key_Binding *)0x0;
  ppKVar3 = list;
  while( true ) {
    pKVar1 = *ppKVar3;
    if (pKVar1 == (Key_Binding *)0x0) {
      return;
    }
    if ((pKVar1->key == key) && (pKVar1->state == state)) break;
    ppKVar3 = &pKVar1->next;
    pKVar2 = pKVar1;
  }
  ppKVar3 = &pKVar2->next;
  if (pKVar2 == (Key_Binding *)0x0) {
    ppKVar3 = list;
  }
  *ppKVar3 = pKVar1->next;
  operator_delete(pKVar1,0x18);
  return;
}

Assistant:

void Fl_Text_Editor::remove_key_binding(int key, int state, Key_Binding** list) {
  Key_Binding *cur, *last = 0;
  for (cur = *list; cur; last = cur, cur = cur->next)
    if (cur->key == key && cur->state == state) break;
  if (!cur) return;
  if (last) last->next = cur->next;
  else *list = cur->next;
  delete cur;
}